

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

TaskSpec * __thiscall
Database::allocate_task
          (Database *this,string *request,string *conn_id,
          vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
          *locks)

{
  pointer pvVar1;
  TaskSpec *pTVar2;
  __index_type _Var3;
  bool bVar4;
  runtime_error *this_00;
  pointer lock;
  string_view_t fmt;
  string_view_t fmt_00;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>,_bool>
  pVar5;
  __single_object new_task;
  uint64_t task_id;
  uint64_t epoch_ms;
  
  lock = (locks->
         super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (locks->
           super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (lock == pvVar1) {
      task_id = this->last_task_id + 1;
      this->last_task_id = task_id;
      epoch_ms = get_milli_timestamp();
      std::
      make_unique<TaskSpec,unsigned_long&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long&,std::vector<std::variant<DatasetLock,IteratorLock>,std::allocator<std::variant<DatasetLock,IteratorLock>>>const&>
                ((unsigned_long *)&new_task,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&task_id,
                 conn_id,(unsigned_long *)request,
                 (vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                  *)&epoch_ms);
      pVar5 = std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_long&,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->tasks,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &task_id,&new_task);
      pTVar2 = *(TaskSpec **)
                ((long)pVar5.first.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
                + 0x10);
      std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>::~unique_ptr(&new_task);
      return pTVar2;
    }
    describe_lock_abi_cxx11_((string *)&task_id,lock);
    fmt.size_ = (size_t)&task_id;
    fmt.data_ = (char *)0x8;
    spdlog::info<std::__cxx11::string>
              ((spdlog *)"LOCK: {}",fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)locks);
    std::__cxx11::string::~string((string *)&task_id);
    _Var3 = (lock->super__Variant_base<DatasetLock,_IteratorLock>).
            super__Move_assign_alias<DatasetLock,_IteratorLock>.
            super__Copy_assign_alias<DatasetLock,_IteratorLock>.
            super__Move_ctor_alias<DatasetLock,_IteratorLock>.
            super__Copy_ctor_alias<DatasetLock,_IteratorLock>.
            super__Variant_storage_alias<DatasetLock,_IteratorLock>._M_index;
    task_id = (uint64_t)this;
    if (_Var3 == 0xff) {
      std::__throw_bad_variant_access("std::visit: variant is valueless");
      _Var3 = (lock->super__Variant_base<DatasetLock,_IteratorLock>).
              super__Move_assign_alias<DatasetLock,_IteratorLock>.
              super__Copy_assign_alias<DatasetLock,_IteratorLock>.
              super__Move_ctor_alias<DatasetLock,_IteratorLock>.
              super__Copy_ctor_alias<DatasetLock,_IteratorLock>.
              super__Variant_storage_alias<DatasetLock,_IteratorLock>._M_index;
    }
    bVar4 = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Database.cpp:89:25)_&&,_const_std::variant<DatasetLock,_IteratorLock>_&>
              ::_S_vtable._M_arr[(char)_Var3]._M_data)((anon_class_8_1_8991fb9c *)&task_id,lock);
    if (!bVar4) break;
    lock = lock + 1;
  }
  describe_lock_abi_cxx11_((string *)&task_id,lock);
  fmt_00.size_ = (size_t)&task_id;
  fmt_00.data_ = (char *)0xe;
  spdlog::warn<std::__cxx11::string>
            ((spdlog *)"Can\'t lock {}!",fmt_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)locks);
  std::__cxx11::string::~string((string *)&task_id);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t acquire lock");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TaskSpec *Database::allocate_task(const std::string &request,
                                  const std::string &conn_id,
                                  const std::vector<DatabaseLock> &locks) {
    for (const auto &lock : locks) {
        spdlog::info("LOCK: {}", describe_lock(lock));
        if (!std::visit([this](auto &l) { return can_acquire(l); }, lock)) {
            spdlog::warn("Can't lock {}!", describe_lock(lock));
            throw std::runtime_error("Can't acquire lock");
        }
    }
    uint64_t task_id = allocate_task_id();
    uint64_t epoch_ms = get_milli_timestamp();
    auto new_task{
        std::make_unique<TaskSpec>(task_id, conn_id, request, epoch_ms, locks)};
    return tasks.emplace(task_id, std::move(new_task)).first->second.get();
}